

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

void __thiscall QListWidgetItem::setData(QListWidgetItem *this,int role,QVariant *value)

{
  QList<QWidgetItemData> *this_00;
  QWidgetItemData *pQVar1;
  QListWidgetItemPrivate *pQVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  long lVar6;
  QListModel *__s;
  int *piVar7;
  pointer pQVar8;
  undefined8 *puVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_88;
  undefined1 local_68 [8];
  anon_union_24_3_e3d07ef4_for_data aStack_60;
  QModelIndex *local_38;
  
  local_38 = *(QModelIndex **)(in_FS_OFFSET + 0x28);
  iVar11 = 0;
  if (role != 2) {
    iVar11 = role;
  }
  lVar6 = (this->d->values).d.size;
  if (lVar6 != 0) {
    pQVar1 = (this->d->values).d.ptr;
    lVar12 = -8;
    lVar10 = 0;
    do {
      if (*(int *)((long)&pQVar1->role + lVar10) == iVar11) {
        cVar5 = ::QVariant::equals((QVariant *)((long)pQVar1 - lVar12));
        if (cVar5 != '\0') {
          bVar3 = false;
          goto LAB_00586e62;
        }
        pQVar8 = QList<QWidgetItemData>::data(&this->d->values);
        ::QVariant::operator=((QVariant *)((long)pQVar8 - lVar12),value);
        bVar3 = true;
        bVar4 = true;
        goto LAB_00586e64;
      }
      lVar12 = lVar12 + -0x28;
      lVar10 = lVar10 + 0x28;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  bVar3 = true;
LAB_00586e62:
  bVar4 = false;
LAB_00586e64:
  if (bVar3) {
    if (!bVar4) {
      pQVar2 = this->d;
      this_00 = &pQVar2->values;
      local_68._0_4_ = iVar11;
      ::QVariant::QVariant((QVariant *)&aStack_60,value);
      QtPrivate::QMovableArrayOps<QWidgetItemData>::emplace<QWidgetItemData>
                ((QMovableArrayOps<QWidgetItemData> *)this_00,(pQVar2->values).d.size,
                 (QWidgetItemData *)local_68);
      QList<QWidgetItemData>::end(this_00);
      ::QVariant::~QVariant((QVariant *)&aStack_60);
    }
    __s = listModel(this);
    if (__s != (QListModel *)0x0) {
      if (iVar11 == 0) {
        local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        puVar9 = (undefined8 *)QArrayData::allocate((QArrayData **)local_68,4,0x10,2,KeepSize);
        local_88 = (QArrayData *)local_68;
        *puVar9 = 0x200000000;
      }
      else {
        local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        piVar7 = (int *)QArrayData::allocate((QArrayData **)local_68,4,0x10,1,KeepSize);
        local_88 = (QArrayData *)local_68;
        *piVar7 = iVar11;
      }
      aStack_60._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      aStack_60.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      QListModel::index((QListModel *)local_68,(char *)__s,(int)this);
      QAbstractItemModel::dataChanged
                ((QModelIndex *)__s,(QModelIndex *)local_68,(QList_conflict *)local_68);
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,4,0x10);
        }
      }
    }
  }
  if (*(QModelIndex **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidgetItem::setData(int role, const QVariant &value)
{
    bool found = false;
    role = (role == Qt::EditRole ? Qt::DisplayRole : role);
    for (int i = 0; i < d->values.size(); ++i) {
        if (d->values.at(i).role == role) {
            if (d->values.at(i).value == value)
                return;
            d->values[i].value = value;
            found = true;
            break;
        }
    }
    if (!found)
        d->values.append(QWidgetItemData(role, value));
    if (QListModel *model = listModel()) {
        const QList<int> roles((role == Qt::DisplayRole)
                                       ? QList<int>({ Qt::DisplayRole, Qt::EditRole })
                                       : QList<int>({ role }));
        model->itemChanged(this, roles);
    }
}